

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexGroup.cpp
# Opt level: O0

void __thiscall VertexGroup::delVertex(VertexGroup *this,int _id)

{
  bool bVar1;
  int in_ESI;
  Vertex *in_RDI;
  iterator it;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18 [3];
  
  if (in_ESI < 1000000) {
    *(undefined1 *)((long)in_RDI[1000000].pos.x + (long)in_ESI) = 1;
    local_18[0]._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      bVar1 = std::operator!=(local_18,&local_20);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)in_RDI);
      Vertex::delNeighborVertex(in_RDI,in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd8 =
           std::_Rb_tree_const_iterator<int>::operator++
                     (in_stack_ffffffffffffffd8._M_node,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void VertexGroup::delVertex(int _id){
	if(_id >= Config::MAX_NUM_VERTICES){
		return;
	}	
	isDeleted[_id] = true;

	for(set<int>::iterator it = group[_id].neighborVertexIds.begin();it != group[_id].neighborVertexIds.end();it++){
		group[(*it)].delNeighborVertex(_id);
	}

}